

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O2

Enum __thiscall
ViconDataStreamSDK::Core::VClient::SetTimingLog
          (VClient *this,string *i_rClientLog,string *i_rCGStreamLog)

{
  element_type *peVar1;
  bool bVar2;
  char cVar3;
  Enum EVar5;
  element_type *this_00;
  __shared_ptr<ViconDataStreamSDK::Core::VClientTimingLog,_(__gnu_cxx::_Lock_policy)2> local_40;
  int iVar4;
  
  this_00 = (this->m_pTimingLog).
            super___shared_ptr<ViconDataStreamSDK::Core::VClientTimingLog,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  if (this_00 == (element_type *)0x0) {
    std::make_shared<ViconDataStreamSDK::Core::VClientTimingLog>();
    std::__shared_ptr<ViconDataStreamSDK::Core::VClientTimingLog,_(__gnu_cxx::_Lock_policy)2>::
    operator=(&(this->m_pTimingLog).
               super___shared_ptr<ViconDataStreamSDK::Core::VClientTimingLog,_(__gnu_cxx::_Lock_policy)2>
              ,&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    this_00 = (this->m_pTimingLog).
              super___shared_ptr<ViconDataStreamSDK::Core::VClientTimingLog,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
  }
  bVar2 = VClientTimingLog::CreateLog(this_00,i_rClientLog);
  peVar1 = (this->m_pClient).
           super___shared_ptr<ViconCGStreamClientSDK::ICGClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    std::__cxx11::string::_M_assign((string *)&this->m_ClientLogFile);
    cVar3 = '\x01';
  }
  else {
    iVar4 = (*peVar1->_vptr_ICGClient[0x18])(peVar1,i_rCGStreamLog);
    cVar3 = (char)iVar4;
  }
  EVar5 = Success;
  if (cVar3 == '\0') {
    EVar5 = InvalidOperation;
  }
  if (!bVar2) {
    EVar5 = InvalidOperation;
  }
  return EVar5;
}

Assistant:

Result::Enum VClient::SetTimingLog(const std::string & i_rClientLog, const std::string & i_rCGStreamLog )
{
  if (!m_pTimingLog)
  {
    m_pTimingLog = std::make_shared< VClientTimingLog >();
  }

  bool bClientLogOk = m_pTimingLog->CreateLog(i_rClientLog);
  bool bCGStreamLogOK = true;
  if( m_pClient )
  {
    bCGStreamLogOK = m_pClient->SetLogFile(i_rCGStreamLog);
  }
  else
  {
    m_ClientLogFile = i_rCGStreamLog;
  }

  Result::Enum Output = ( bClientLogOk && bCGStreamLogOK ) ? Result::Success : Result::InvalidOperation;
  return Output;
}